

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 367_validPerfectSqr.cpp
# Opt level: O0

bool isPerfectSquare(int num)

{
  long local_18;
  unsigned_long_long i;
  int num_local;
  
  local_18 = 1;
  while( true ) {
    if ((ulong)(long)num <= (ulong)(local_18 * local_18) && local_18 * local_18 - (long)num != 0) {
      return false;
    }
    if (local_18 * local_18 - (long)num == 0) break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool isPerfectSquare(int num) {
    unsigned long long int i=1;
    while (i*i <= num)
    {
        if (i*i == num)
            return true;
        i++;
    }
    return false;
}